

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uutils.c
# Opt level: O2

int c_string_to_lisp_string(char *C,LispPTR Lisp)

{
  uint uVar1;
  LispPTR LVar2;
  DLword *pDVar3;
  size_t sVar4;
  LispPTR *pLVar5;
  ulong uVar6;
  int iVar7;
  
  iVar7 = -1;
  if ((*(ushort *)((ulong)(Lisp >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 0xe) {
    sVar4 = strlen(C);
    pLVar5 = NativeAligned4FromLAddr(Lisp);
    pDVar3 = Lisp_world;
    if ((sVar4 + 1 <= (ulong)(long)(int)pLVar5[3]) && (*(char *)((long)pLVar5 + 6) == 'C')) {
      uVar1 = *pLVar5;
      LVar2 = pLVar5[1];
      iVar7 = 0;
      for (uVar6 = 0; sVar4 + 1 != uVar6; uVar6 = uVar6 + 1) {
        *(char *)((long)pDVar3 + uVar6 + (ulong)(ushort)LVar2 + (ulong)(uVar1 & 0xfffffff) * 2 ^ 3)
             = C[uVar6];
      }
    }
  }
  return iVar7;
}

Assistant:

static int c_string_to_lisp_string(char *C, LispPTR Lisp) {
  OneDArray *arrayp;
  char *base;
  size_t length;

  length = strlen(C);
  if (GetTypeNumber(Lisp) != TYPE_ONED_ARRAY) { return (-1); }

  arrayp = (OneDArray *)NativeAligned4FromLAddr(Lisp);
  if (arrayp->totalsize < length + 1) { return (-1); }
  /* too short for C string */

  switch (arrayp->typenumber) {
    case THIN_CHAR_TYPENUMBER:
      base = ((char *)NativeAligned2FromLAddr(arrayp->base)) + ((int)(arrayp->offset));
#ifndef BYTESWAP
      strcpy(base, C);
#else
      {
        char *dp = C;
        for (size_t i = 0; i < length + 1; i++) {
          char ch = *dp++;
#ifdef DOS
          if (ch == '\\') dp++; /* skip 2nd \ in \\ in C strings */
#endif /* DOS */
          GETBYTE(base++) = ch;
        }
      }
#endif /* BYTESWAP */

      return 0;
    default: return -1;
  }
}